

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

Abc_Obj_t *
Abc_NodeFromIf_rec(Abc_Ntk_t *pNtkNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Int_t *vCover)

{
  DdManager *pDVar1;
  Mem_Flex_t *pMVar2;
  Hop_Man_t *pMan;
  int iVar3;
  int iVar4;
  If_Cut_t *pCut;
  Abc_Obj_t *pAVar5;
  word *pwVar6;
  int *pArrTimeProfile;
  uint *puVar7;
  DdNode *pDVar8;
  char *pcVar9;
  Hop_Obj_t *pHVar10;
  bool bVar11;
  Abc_Obj_t *local_140;
  word *pTruth;
  int RetValue;
  Abc_Obj_t *pFanins [15];
  If_Obj_t *pIStack_48;
  int i;
  If_Obj_t *pIfLeaf;
  If_Cut_t *pCutBest;
  Abc_Obj_t *pNodeNew;
  Vec_Int_t *vCover_local;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pNtkNew_local = (Abc_Ntk_t *)If_ObjCopy(pIfObj);
  if (pNtkNew_local == (Abc_Ntk_t *)0x0) {
    if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
      __assert_fail("pIfObj->Type == IF_AND",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                    ,0x1be,
                    "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                   );
    }
    pCut = If_ObjCutBest(pIfObj);
    if (pIfMan->pPars->fUserSesLib == 0) {
      pCutBest = (If_Cut_t *)Abc_NtkCreateNode(pNtkNew);
      if ((((pIfMan->pPars->fDelayOpt == 0) && (pIfMan->pPars->fDelayOptLut == 0)) &&
          (pIfMan->pPars->fDsdBalance == 0)) &&
         (((pIfMan->pPars->fUseTtPerm == 0 && (pIfMan->pPars->pLutStruct == (char *)0x0)) &&
          ((pIfMan->pPars->fUserRecLib == 0 &&
           ((pIfMan->pPars->fUserSesLib == 0 && (pIfMan->pPars->nGateSize == 0)))))))) {
        If_CutRotatePins(pIfMan,pCut);
      }
      if ((pIfMan->pPars->fUseCnfs == 0) && (pIfMan->pPars->fUseMv == 0)) {
        pFanins[0xe]._4_4_ = 0;
        while( true ) {
          bVar11 = false;
          if ((int)pFanins[0xe]._4_4_ < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            pIStack_48 = If_ManObj(pIfMan,(int)(&pCut[1].Area)[(int)pFanins[0xe]._4_4_]);
            bVar11 = pIStack_48 != (If_Obj_t *)0x0;
          }
          if (!bVar11) break;
          pAVar5 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIStack_48,vCover);
          Abc_ObjAddFanin((Abc_Obj_t *)pCutBest,pAVar5);
          pFanins[0xe]._4_4_ = pFanins[0xe]._4_4_ + 1;
        }
      }
      else {
        pFanins[0xe]._4_4_ = *(uint *)&pCut->field_0x1c >> 0x18;
        while( true ) {
          pFanins[0xe]._4_4_ = pFanins[0xe]._4_4_ - 1;
          bVar11 = false;
          if (-1 < (int)pFanins[0xe]._4_4_) {
            pIStack_48 = If_ManObj(pIfMan,(int)(&pCut[1].Area)[(int)pFanins[0xe]._4_4_]);
            bVar11 = pIStack_48 != (If_Obj_t *)0x0;
          }
          if (!bVar11) break;
          pAVar5 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIStack_48,vCover);
          Abc_ObjAddFanin((Abc_Obj_t *)pCutBest,pAVar5);
        }
      }
      iVar3 = Abc_ObjLevelNew((Abc_Obj_t *)pCutBest);
      *(uint *)&((Abc_Obj_t *)pCutBest)->field_0x14 =
           *(uint *)&((Abc_Obj_t *)pCutBest)->field_0x14 & 0xfff | iVar3 << 0xc;
      if (pIfMan->pPars->fTruth == 0) {
        pHVar10 = Abc_NodeIfToHop((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pIfObj);
        (((Abc_Obj_t *)pCutBest)->field_5).pData = pHVar10;
      }
      else {
        if (pIfMan->pPars->fUseBdds == 0) {
          if ((pIfMan->pPars->fUseCnfs == 0) && (pIfMan->pPars->fUseMv == 0)) {
            if ((pIfMan->pPars->fUseSops == 0) && (pIfMan->pPars->nGateSize < 1)) {
              if (pIfMan->pPars->fDelayOpt == 0) {
                if (pIfMan->pPars->fDsdBalance == 0) {
                  if (pIfMan->pPars->fUserRecLib == 0) {
                    pwVar6 = If_CutTruthW(pIfMan,pCut);
                    if (pIfMan->pPars->fUseTtPerm != 0) {
                      for (pFanins[0xe]._4_4_ = 0;
                          (int)pFanins[0xe]._4_4_ < (int)(*(uint *)&pCut->field_0x1c >> 0x18);
                          pFanins[0xe]._4_4_ = pFanins[0xe]._4_4_ + 1) {
                        iVar3 = If_CutLeafBit(pCut,pFanins[0xe]._4_4_);
                        if (iVar3 != 0) {
                          iVar3 = Abc_TtWordNum(*(uint *)&pCut->field_0x1c >> 0x18);
                          Abc_TtFlip(pwVar6,iVar3,pFanins[0xe]._4_4_);
                        }
                      }
                    }
                    pMan = (Hop_Man_t *)pNtkNew->pManFunc;
                    iVar3 = If_CutLeaveNum(pCut);
                    pHVar10 = Kit_TruthToHop(pMan,(uint *)pwVar6,iVar3,vCover);
                    (((Abc_Obj_t *)pCutBest)->field_5).pData = pHVar10;
                  }
                  else {
                    pHVar10 = Abc_RecToHop3((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pCut,pIfObj);
                    (((Abc_Obj_t *)pCutBest)->field_5).pData = pHVar10;
                  }
                }
                else {
                  pHVar10 = Abc_NodeBuildFromMini((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pCut,1);
                  (((Abc_Obj_t *)pCutBest)->field_5).pData = pHVar10;
                }
              }
              else {
                pHVar10 = Abc_NodeBuildFromMini((Hop_Man_t *)pNtkNew->pManFunc,pIfMan,pCut,0);
                (((Abc_Obj_t *)pCutBest)->field_5).pData = pHVar10;
              }
            }
            else {
              puVar7 = If_CutTruth(pIfMan,pCut);
              iVar3 = If_CutLeaveNum(pCut);
              iVar3 = Kit_TruthIsop(puVar7,iVar3,vCover,1);
              if ((iVar3 != 0) && (iVar3 != 1)) {
                __assert_fail("RetValue == 0 || RetValue == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                              ,0x1f2,
                              "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                             );
              }
              iVar4 = Vec_IntSize(vCover);
              if ((iVar4 == 0) ||
                 ((iVar4 = Vec_IntSize(vCover), iVar4 == 1 &&
                  (iVar4 = Vec_IntEntry(vCover,0), iVar4 == 0)))) {
                if (iVar3 != 0) {
                  __assert_fail("RetValue == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                                ,0x1f6,
                                "Abc_Obj_t *Abc_NodeFromIf_rec(Abc_Ntk_t *, If_Man_t *, If_Obj_t *, Vec_Int_t *)"
                               );
                }
                pMVar2 = (Mem_Flex_t *)pNtkNew->pManFunc;
                iVar3 = If_CutLeaveNum(pCut);
                pcVar9 = Abc_SopCreateAnd(pMVar2,iVar3,(int *)0x0);
                (((Abc_Obj_t *)pCutBest)->field_5).pData = pcVar9;
                iVar3 = Vec_IntSize(vCover);
                if (iVar3 == 0) {
                  local_140 = Abc_NtkCreateNodeConst0(pNtkNew);
                }
                else {
                  local_140 = Abc_NtkCreateNodeConst1(pNtkNew);
                }
                pCutBest = (If_Cut_t *)local_140;
              }
              else {
                pMVar2 = (Mem_Flex_t *)pNtkNew->pManFunc;
                iVar4 = If_CutLeaveNum(pCut);
                pcVar9 = Abc_SopCreateFromIsop(pMVar2,iVar4,vCover);
                (((Abc_Obj_t *)pCutBest)->field_5).pData = pcVar9;
                if (iVar3 != 0) {
                  Abc_SopComplement((char *)(((Abc_Obj_t *)pCutBest)->field_5).pData);
                }
              }
            }
          }
          else {
            pDVar1 = (DdManager *)pNtkNew->pManFunc;
            puVar7 = If_CutTruth(pIfMan,pCut);
            iVar3 = If_CutLeaveNum(pCut);
            pDVar8 = Kit_TruthToBdd(pDVar1,puVar7,iVar3,1);
            (((Abc_Obj_t *)pCutBest)->field_5).pData = pDVar8;
            Cudd_Ref((DdNode *)(((Abc_Obj_t *)pCutBest)->field_5).pData);
          }
        }
        else {
          pDVar1 = (DdManager *)pNtkNew->pManFunc;
          puVar7 = If_CutTruth(pIfMan,pCut);
          iVar3 = If_CutLeaveNum(pCut);
          pDVar8 = Kit_TruthToBdd(pDVar1,puVar7,iVar3,0);
          (((Abc_Obj_t *)pCutBest)->field_5).pData = pDVar8;
          Cudd_Ref((DdNode *)(((Abc_Obj_t *)pCutBest)->field_5).pData);
        }
        if ((((*(uint *)&pCut->field_0x1c >> 0xc & 1) != 0) && (pIfMan->pPars->fDelayOpt == 0)) &&
           (pIfMan->pPars->fDsdBalance == 0)) {
          Abc_NodeComplement((Abc_Obj_t *)pCutBest);
        }
      }
      If_ObjSetCopy(pIfObj,pCutBest);
      pNtkNew_local = (Abc_Ntk_t *)pCutBest;
    }
    else {
      pFanins[0xe]._4_4_ = 0;
      while( true ) {
        bVar11 = false;
        if ((int)pFanins[0xe]._4_4_ < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
          pIStack_48 = If_ManObj(pIfMan,(int)(&pCut[1].Area)[(int)pFanins[0xe]._4_4_]);
          bVar11 = pIStack_48 != (If_Obj_t *)0x0;
        }
        if (!bVar11) break;
        pAVar5 = Abc_NodeFromIf_rec(pNtkNew,pIfMan,pIStack_48,vCover);
        *(Abc_Obj_t **)(&stack0xffffffffffffff38 + (long)(int)pFanins[0xe]._4_4_ * 8) = pAVar5;
        pFanins[0xe]._4_4_ = pFanins[0xe]._4_4_ + 1;
      }
      pwVar6 = If_CutTruthW(pIfMan,pCut);
      iVar3 = If_CutLeaveNum(pCut);
      pArrTimeProfile = If_CutArrTimeProfile(pIfMan,pCut);
      pNtkNew_local =
           (Abc_Ntk_t *)
           Abc_ExactBuildNode(pwVar6,iVar3,pArrTimeProfile,(Abc_Obj_t **)&stack0xffffffffffffff38,
                              pNtkNew);
      If_ObjSetCopy(pIfObj,pNtkNew_local);
    }
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NodeFromIf_rec( Abc_Ntk_t * pNtkNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNodeNew;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfLeaf;
    int i;
    // return if the result if known
    pNodeNew = (Abc_Obj_t *)If_ObjCopy( pIfObj );
    if ( pNodeNew )
        return pNodeNew;
    assert( pIfObj->Type == IF_AND );
    // get the parameters of the best cut
    pCutBest = If_ObjCutBest( pIfObj );
    if ( pIfMan->pPars->fUserSesLib )
    {
        // create the subgraph composed of Abc_Obj_t nodes based on the given cut
        Abc_Obj_t * pFanins[IF_MAX_FUNC_LUTSIZE];
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            pFanins[i] = Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover);
        pNodeNew = Abc_ExactBuildNode( If_CutTruthW(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), If_CutArrTimeProfile(pIfMan, pCutBest), pFanins, pNtkNew );
        If_ObjSetCopy( pIfObj, pNodeNew );
        return pNodeNew;
    }
    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
//    if ( pIfMan->pPars->pLutLib && pIfMan->pPars->pLutLib->fVarPinDelays )
    if ( !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && !pIfMan->pPars->fUseTtPerm && 
         !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->fUserSesLib && !pIfMan->pPars->nGateSize )
        If_CutRotatePins( pIfMan, pCutBest );
    if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
    {
        If_CutForEachLeafReverse( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    else
    {
        If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, i )
            Abc_ObjAddFanin( pNodeNew, Abc_NodeFromIf_rec(pNtkNew, pIfMan, pIfLeaf, vCover) );
    }
    // set the level of the new node
    pNodeNew->Level = Abc_ObjLevelNew( pNodeNew );
    // derive the function of this node
    if ( pIfMan->pPars->fTruth )
    {
        if ( pIfMan->pPars->fUseBdds )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 0 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseCnfs || pIfMan->pPars->fUseMv )
        { 
            // transform truth table into the BDD 
#ifdef ABC_USE_CUDD
            pNodeNew->pData = Kit_TruthToBdd( (DdManager *)pNtkNew->pManFunc, If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), 1 );  Cudd_Ref((DdNode *)pNodeNew->pData); 
#endif
        }
        else if ( pIfMan->pPars->fUseSops || pIfMan->pPars->nGateSize > 0 ) 
        {
            // transform truth table into the SOP
            int RetValue = Kit_TruthIsop( If_CutTruth(pIfMan, pCutBest), If_CutLeaveNum(pCutBest), vCover, 1 );
            assert( RetValue == 0 || RetValue == 1 );
            // check the case of constant cover
            if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
            {
                assert( RetValue == 0 );
                pNodeNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), NULL );
                pNodeNew = (Vec_IntSize(vCover) == 0) ? Abc_NtkCreateNodeConst0(pNtkNew) : Abc_NtkCreateNodeConst1(pNtkNew);
            }
            else
            {
                // derive the AIG for that tree
                pNodeNew->pData = Abc_SopCreateFromIsop( (Mem_Flex_t *)pNtkNew->pManFunc, If_CutLeaveNum(pCutBest), vCover );
                if ( RetValue )
                    Abc_SopComplement( (char *)pNodeNew->pData );
            }
        }
        else if ( pIfMan->pPars->fDelayOpt )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 0 );
        else if ( pIfMan->pPars->fDsdBalance )
            pNodeNew->pData = Abc_NodeBuildFromMini( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, 1 );
        else if ( pIfMan->pPars->fUserRecLib )
        {
            extern Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj );
            pNodeNew->pData = Abc_RecToHop3( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pCutBest, pIfObj ); 
        }
        else
        {
            extern Hop_Obj_t * Kit_TruthToHop( Hop_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory );
            word * pTruth = If_CutTruthW(pIfMan, pCutBest);
            if ( pIfMan->pPars->fUseTtPerm )
                for ( i = 0; i < (int)pCutBest->nLeaves; i++ )
                    if ( If_CutLeafBit(pCutBest, i) )
                        Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), i );
            pNodeNew->pData = Kit_TruthToHop( (Hop_Man_t *)pNtkNew->pManFunc, (unsigned *)pTruth, If_CutLeaveNum(pCutBest), vCover );
//            if ( pIfMan->pPars->fUseBat )
//                Bat_ManFuncPrintCell( *pTruth );
        }
        // complement the node if the cut was complemented
        if ( pCutBest->fCompl && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDsdBalance )
            Abc_NodeComplement( pNodeNew );
    }
    else
    {
        pNodeNew->pData = Abc_NodeIfToHop( (Hop_Man_t *)pNtkNew->pManFunc, pIfMan, pIfObj );
    }
    If_ObjSetCopy( pIfObj, pNodeNew );
    return pNodeNew;
}